

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.cpp
# Opt level: O0

void __thiscall duckdb::ZSTDCompressionState::AddString(ZSTDCompressionState *this,string_t *string)

{
  uint uVar1;
  idx_t in;
  ZSTDCompressionState *in_RSI;
  SegmentStatistics *in_RDI;
  ZSTDCompressionState *unaff_retaddr;
  bool final_tuple;
  bool in_stack_000000a7;
  string_t *in_stack_000000a8;
  ZSTDCompressionState *in_stack_000000b0;
  string_t *in_stack_ffffffffffffffd8;
  
  if (*(long *)((long)&in_RDI[3].statistics.stats_union + 0x10) == 0) {
    InitializeVector(unaff_retaddr);
  }
  in = string_t::GetSize((string_t *)in_RSI);
  uVar1 = UnsafeNumericCast<unsigned_int,unsigned_long,void>(in);
  *(uint *)(*(long *)((long)&in_RDI[3].statistics.stats_union + 8) +
           *(long *)((long)&in_RDI[3].statistics.stats_union + 0x10) * 4) = uVar1;
  CompressString(in_stack_000000b0,in_stack_000000a8,in_stack_000000a7);
  *(long *)((long)&in_RDI[3].statistics.stats_union + 0x10) =
       *(long *)((long)&in_RDI[3].statistics.stats_union + 0x10) + 1;
  if (*(long *)((long)&in_RDI[3].statistics.stats_union + 0x10) ==
      *(long *)((long)&in_RDI[3].statistics.stats_union + 0x18)) {
    FlushVector(in_RSI);
  }
  unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
            ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true> *)
             in_RDI);
  UncompressedStringStorage::UpdateStringStats(in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

void AddString(const string_t &string) {
		if (!tuple_count) {
			InitializeVector();
		}

		string_lengths[tuple_count] = UnsafeNumericCast<string_length_t>(string.GetSize());
		bool final_tuple = tuple_count + 1 >= vector_size;
		CompressString(string, final_tuple);

		tuple_count++;
		if (tuple_count == vector_size) {
			// Reached the end of this vector
			FlushVector();
		}

		UncompressedStringStorage::UpdateStringStats(segment->stats, string);
	}